

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_init_key(blake2sp_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  blake2sp_state *S_00;
  long lVar2;
  uint8_t block [64];
  
  if ((0xffffffffffffffdf < outlen - 0x21) &&
     (0xffffffffffffffdf < keylen - 0x21 && key != (void *)0x0)) {
    memset(S->buf,0,0x208);
    S->outlen = outlen;
    iVar1 = blake2sp_init_root(S->R,outlen,keylen);
    if (-1 < iVar1) {
      lVar2 = 0;
      S_00 = S;
      do {
        if (lVar2 == 8) {
          S->R[0].last_node = '\x01';
          S->S[7][0].last_node = '\x01';
          block[0x30] = '\0';
          block[0x31] = '\0';
          block[0x32] = '\0';
          block[0x33] = '\0';
          block[0x34] = '\0';
          block[0x35] = '\0';
          block[0x36] = '\0';
          block[0x37] = '\0';
          block[0x38] = '\0';
          block[0x39] = '\0';
          block[0x3a] = '\0';
          block[0x3b] = '\0';
          block[0x3c] = '\0';
          block[0x3d] = '\0';
          block[0x3e] = '\0';
          block[0x3f] = '\0';
          block[0x20] = '\0';
          block[0x21] = '\0';
          block[0x22] = '\0';
          block[0x23] = '\0';
          block[0x24] = '\0';
          block[0x25] = '\0';
          block[0x26] = '\0';
          block[0x27] = '\0';
          block[0x28] = '\0';
          block[0x29] = '\0';
          block[0x2a] = '\0';
          block[0x2b] = '\0';
          block[0x2c] = '\0';
          block[0x2d] = '\0';
          block[0x2e] = '\0';
          block[0x2f] = '\0';
          block[0x10] = '\0';
          block[0x11] = '\0';
          block[0x12] = '\0';
          block[0x13] = '\0';
          block[0x14] = '\0';
          block[0x15] = '\0';
          block[0x16] = '\0';
          block[0x17] = '\0';
          block[0x18] = '\0';
          block[0x19] = '\0';
          block[0x1a] = '\0';
          block[0x1b] = '\0';
          block[0x1c] = '\0';
          block[0x1d] = '\0';
          block[0x1e] = '\0';
          block[0x1f] = '\0';
          block[0] = '\0';
          block[1] = '\0';
          block[2] = '\0';
          block[3] = '\0';
          block[4] = '\0';
          block[5] = '\0';
          block[6] = '\0';
          block[7] = '\0';
          block[8] = '\0';
          block[9] = '\0';
          block[10] = '\0';
          block[0xb] = '\0';
          block[0xc] = '\0';
          block[0xd] = '\0';
          block[0xe] = '\0';
          block[0xf] = '\0';
          memcpy(block,key,keylen);
          for (lVar2 = 0; lVar2 != 0x440; lVar2 = lVar2 + 0x88) {
            blake2s_update((blake2s_state *)((long)S->S[0][0].h + lVar2),block,0x40);
          }
          memset(block,0,0x40);
          return 0;
        }
        iVar1 = blake2sp_init_leaf((blake2s_state *)S_00,outlen,keylen,(uint32_t)lVar2);
        lVar2 = lVar2 + 1;
        S_00 = (blake2sp_state *)(S_00->S + 1);
      } while (-1 < iVar1);
    }
  }
  return -1;
}

Assistant:

int blake2sp_init_key( blake2sp_state *S, size_t outlen, const void *key, size_t keylen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, keylen ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}